

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adler32.cpp
# Opt level: O0

uint32_t __thiscall
boost::deflate::detail::adler32_test::eq(adler32_test *this,char *data,int size,uint32_t init)

{
  uint uVar1;
  size_t sVar2;
  uLong uVar3;
  undefined4 local_60;
  undefined8 local_48;
  undefined4 local_38;
  undefined4 local_30;
  uint32_t init_local;
  int size_local;
  char *data_local;
  adler32_test *this_local;
  
  local_30 = size;
  if (size < 1) {
    sVar2 = strlen(data);
    local_30 = (uint)sVar2;
  }
  local_38 = init;
  if (init == 0xffffffff) {
    local_38 = adler32((uchar *)0x0,0,0);
  }
  uVar1 = adler32((uchar *)data,local_30,local_38);
  if (init == 0xffffffff) {
    local_48 = ::adler32(0,(Bytef *)0x0,0);
  }
  else {
    local_48 = (ulong)init;
  }
  local_60 = size;
  if (size < 1) {
    sVar2 = strlen(data);
    local_60 = (uInt)sVar2;
  }
  uVar3 = ::adler32(local_48,(Bytef *)data,local_60);
  return (uint32_t)(uVar1 == uVar3);
}

Assistant:

std::uint32_t eq(const char* data, int size = -1, std::uint32_t init = -1) {
    return adler32(reinterpret_cast<const unsigned char*>(data),
                   size > 0 ? size : std::strlen(data), init != -1U ? init : adler32(nullptr, 0))
           == ::adler32(init != -1U ? init : ::adler32(0, nullptr, 0),
                        reinterpret_cast<const unsigned char*>(data),
                        size > 0 ? size : std::strlen(data));
  }